

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

void __thiscall
kj::_::NetworkFilter::NetworkFilter
          (NetworkFilter *this,ArrayPtr<const_kj::StringPtr> allow,
          ArrayPtr<const_kj::StringPtr> deny,NetworkFilter *next)

{
  Vector<kj::CidrRange> *this_00;
  Vector<kj::CidrRange> *this_01;
  RemoveConst<kj::CidrRange> **ppRVar1;
  char *pcVar2;
  size_t sVar3;
  CidrRange *pCVar4;
  CidrRange *pCVar5;
  RemoveConst<kj::CidrRange> *pRVar6;
  ArrayPtr<const_char> AVar7;
  int iVar8;
  ArrayPtr<const_char> *pAVar9;
  ArrayPtr<const_char> *pAVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ArrayPtr<const_kj::CidrRange> AVar15;
  Fault f;
  CidrRange local_50;
  ArrayPtr<const_char> *local_38;
  
  pAVar9 = &(deny.ptr)->content;
  pAVar10 = &(allow.ptr)->content;
  (this->super_NetworkFilter)._vptr_NetworkFilter = (_func_int **)&PTR_shouldAllow_00645d20;
  this_00 = &this->allowCidrs;
  (this->allowCidrs).builder.ptr = (CidrRange *)0x0;
  (this->allowCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->allowCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->allowCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  this_01 = &this->denyCidrs;
  (this->denyCidrs).builder.ptr = (CidrRange *)0x0;
  (this->denyCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->denyCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->denyCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  this->allowUnix = false;
  this->allowAbstractUnix = false;
  this->allowPublic = false;
  this->allowNetwork = false;
  (this->next).ptr = next;
  if (allow.size_ != 0) {
    local_38 = pAVar10 + allow.size_;
    do {
      pcVar2 = pAVar10->ptr;
      sVar3 = pAVar10->size_;
      AVar7 = *pAVar10;
      lVar12 = sVar3 - 5;
      switch(lVar12) {
      case 0:
switchD_004224bb_caseD_0:
        iVar8 = bcmp(pcVar2,"unix",sVar3);
        if (iVar8 == 0) {
          this->allowUnix = true;
          goto LAB_004225e2;
        }
        if (sVar3 == 0xe) goto switchD_004224bb_caseD_9;
        break;
      case 1:
        iVar8 = bcmp(pcVar2,"local",sVar3);
        if (iVar8 == 0) {
          AVar15 = localCidrs();
          pCVar4 = (this->allowCidrs).builder.ptr;
          uVar14 = ((long)(this->allowCidrs).builder.pos - (long)pCVar4 >> 3) * -0x5555555555555555
                   + AVar15.size_;
          pCVar5 = (this->allowCidrs).builder.endPtr;
          lVar12 = (long)pCVar5 - (long)pCVar4 >> 3;
          if ((ulong)(lVar12 * -0x5555555555555555) < uVar14) {
            uVar13 = lVar12 * 0x5555555555555556;
            if (pCVar5 == pCVar4) {
              uVar13 = 4;
            }
            if (uVar13 < uVar14) {
              uVar13 = uVar14;
            }
            Vector<kj::CidrRange>::setCapacity(this_00,uVar13);
          }
LAB_00422677:
          sVar11 = AVar15.size_;
          pRVar6 = (this->allowCidrs).builder.pos;
          if (sVar11 != 0) {
            memcpy(pRVar6,AVar15.ptr,sVar11 * 0x18);
          }
          (this->allowCidrs).builder.pos = pRVar6 + sVar11;
          goto LAB_004225e2;
        }
        switch(lVar12) {
        case 0:
          goto switchD_004224bb_caseD_0;
        case 2:
          goto switchD_004224bb_caseD_2;
        case 3:
          goto switchD_004224bb_caseD_3;
        case 9:
          goto switchD_004224bb_caseD_9;
        }
        break;
      case 2:
switchD_004224bb_caseD_2:
        iVar8 = bcmp(pcVar2,"public",sVar3);
        if (iVar8 == 0) {
          this->allowPublic = true;
          goto LAB_004225e2;
        }
        if (sVar3 == 0xe) goto switchD_004224bb_caseD_9;
        if (sVar3 == 5) goto switchD_004224bb_caseD_0;
        break;
      case 3:
switchD_004224bb_caseD_3:
        iVar8 = bcmp(pcVar2,"network",sVar3);
        if (iVar8 == 0) {
          this->allowNetwork = true;
          goto LAB_004225e2;
        }
        switch(lVar12) {
        case 0:
          goto switchD_004224bb_caseD_0;
        case 2:
          goto switchD_004224bb_caseD_2;
        case 3:
          iVar8 = bcmp(pcVar2,"private",sVar3);
          if (iVar8 == 0) {
            AVar15 = privateCidrs();
            sVar11 = AVar15.size_;
            pCVar4 = (this->allowCidrs).builder.ptr;
            uVar14 = ((long)(this->allowCidrs).builder.pos - (long)pCVar4 >> 3) *
                     -0x5555555555555555 + sVar11;
            pCVar5 = (this->allowCidrs).builder.endPtr;
            lVar12 = (long)pCVar5 - (long)pCVar4 >> 3;
            if ((ulong)(lVar12 * -0x5555555555555555) < uVar14) {
              uVar13 = lVar12 * 0x5555555555555556;
              if (pCVar5 == pCVar4) {
                uVar13 = 4;
              }
              if (uVar13 < uVar14) {
                uVar13 = uVar14;
              }
              Vector<kj::CidrRange>::setCapacity(this_00,uVar13);
            }
            pRVar6 = (this->allowCidrs).builder.pos;
            if (sVar11 != 0) {
              memcpy(pRVar6,AVar15.ptr,sVar11 * 0x18);
            }
            (this->allowCidrs).builder.pos = pRVar6 + sVar11;
            AVar15 = localCidrs();
            pCVar4 = (this->allowCidrs).builder.ptr;
            uVar14 = ((long)(this->allowCidrs).builder.pos - (long)pCVar4 >> 3) *
                     -0x5555555555555555 + AVar15.size_;
            pCVar5 = (this->allowCidrs).builder.endPtr;
            lVar12 = (long)pCVar5 - (long)pCVar4 >> 3;
            if ((ulong)(lVar12 * -0x5555555555555555) < uVar14) {
              uVar13 = lVar12 * 0x5555555555555556;
              if (pCVar5 == pCVar4) {
                uVar13 = 4;
              }
              if (uVar13 < uVar14) {
                uVar13 = uVar14;
              }
              Vector<kj::CidrRange>::setCapacity(this_00,uVar13);
            }
            goto LAB_00422677;
          }
          if (sVar3 == 5) goto switchD_004224bb_caseD_0;
          if (sVar3 == 0xe) goto switchD_004224bb_caseD_9;
          if (sVar3 == 7) goto switchD_004224bb_caseD_2;
          break;
        case 9:
          goto switchD_004224bb_caseD_9;
        }
        break;
      case 9:
switchD_004224bb_caseD_9:
        iVar8 = bcmp(pcVar2,"unix-abstract",sVar3);
        if (iVar8 != 0) break;
        this->allowAbstractUnix = true;
        goto LAB_004225e2;
      }
      CidrRange::CidrRange(&local_50,(StringPtr)AVar7);
      pCVar4 = (this->allowCidrs).builder.endPtr;
      if ((this->allowCidrs).builder.pos == pCVar4) {
        pCVar5 = (this_00->builder).ptr;
        sVar11 = ((long)pCVar4 - (long)pCVar5 >> 3) * 0x5555555555555556;
        if (pCVar4 == pCVar5) {
          sVar11 = 4;
        }
        Vector<kj::CidrRange>::setCapacity(this_00,sVar11);
      }
      pRVar6 = (this->allowCidrs).builder.pos;
      *(undefined8 *)(pRVar6->bits + 0xc) = local_50._16_8_;
      pRVar6->family = local_50.family;
      pRVar6->bits[0] = local_50.bits[0];
      pRVar6->bits[1] = local_50.bits[1];
      pRVar6->bits[2] = local_50.bits[2];
      pRVar6->bits[3] = local_50.bits[3];
      *(undefined8 *)(pRVar6->bits + 4) = local_50.bits._4_8_;
      ppRVar1 = &(this->allowCidrs).builder.pos;
      *ppRVar1 = *ppRVar1 + 1;
LAB_004225e2:
      pAVar10 = pAVar10 + 1;
    } while (pAVar10 != local_38);
  }
  if (deny.size_ != 0) {
    pAVar10 = pAVar9 + deny.size_;
    do {
      pcVar2 = pAVar9->ptr;
      sVar3 = pAVar9->size_;
      AVar7 = *pAVar9;
      lVar12 = sVar3 - 5;
      switch(lVar12) {
      case 0:
switchD_00422821_caseD_0:
        iVar8 = bcmp(pcVar2,"unix",sVar3);
        if (iVar8 == 0) {
          this->allowUnix = false;
          goto LAB_00422946;
        }
        if (sVar3 == 0xe) goto switchD_00422821_caseD_9;
        break;
      case 1:
        iVar8 = bcmp(pcVar2,"local",sVar3);
        if (iVar8 == 0) {
          AVar15 = localCidrs();
          sVar11 = AVar15.size_;
          pCVar4 = (this->denyCidrs).builder.ptr;
          uVar14 = ((long)(this->denyCidrs).builder.pos - (long)pCVar4 >> 3) * -0x5555555555555555 +
                   sVar11;
          pCVar5 = (this->denyCidrs).builder.endPtr;
          lVar12 = (long)pCVar5 - (long)pCVar4 >> 3;
          if ((ulong)(lVar12 * -0x5555555555555555) < uVar14) {
            uVar13 = lVar12 * 0x5555555555555556;
            if (pCVar5 == pCVar4) {
              uVar13 = 4;
            }
            if (uVar13 < uVar14) {
              uVar13 = uVar14;
            }
            Vector<kj::CidrRange>::setCapacity(this_01,uVar13);
          }
          pRVar6 = (this->denyCidrs).builder.pos;
          if (sVar11 != 0) {
            memcpy(pRVar6,AVar15.ptr,sVar11 * 0x18);
          }
          (this->denyCidrs).builder.pos = pRVar6 + sVar11;
          goto LAB_00422946;
        }
        switch(lVar12) {
        case 0:
          goto switchD_00422821_caseD_0;
        case 2:
          goto switchD_00422821_caseD_2;
        case 3:
          goto switchD_00422821_caseD_3;
        case 9:
          goto switchD_00422821_caseD_9;
        }
        break;
      case 2:
switchD_00422821_caseD_2:
        iVar8 = bcmp(pcVar2,"public",sVar3);
        if (iVar8 == 0) {
          Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                    ((Fault *)&local_50,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                     ,0xc2d,FAILED,(char *)0x0,
                     "\"don\'t deny \'public\', allow \'private\' instead\"",
                     (char (*) [45])"don\'t deny \'public\', allow \'private\' instead");
          Debug::Fault::fatal((Fault *)&local_50);
        }
        if (sVar3 == 0xe) goto switchD_00422821_caseD_9;
        if (sVar3 == 5) goto switchD_00422821_caseD_0;
        break;
      case 3:
switchD_00422821_caseD_3:
        iVar8 = bcmp(pcVar2,"network",sVar3);
        if (iVar8 == 0) {
          Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                    ((Fault *)&local_50,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                     ,0xc28,FAILED,(char *)0x0,
                     "\"don\'t deny \'network\', allow \'local\' instead\"",
                     (char (*) [44])"don\'t deny \'network\', allow \'local\' instead");
          Debug::Fault::fatal((Fault *)&local_50);
        }
        switch(lVar12) {
        case 0:
          goto switchD_00422821_caseD_0;
        case 2:
          goto switchD_00422821_caseD_2;
        case 3:
          iVar8 = bcmp(pcVar2,"private",sVar3);
          if (iVar8 == 0) {
            AVar15 = privateCidrs();
            sVar11 = AVar15.size_;
            pCVar4 = (this->denyCidrs).builder.ptr;
            uVar14 = ((long)(this->denyCidrs).builder.pos - (long)pCVar4 >> 3) * -0x5555555555555555
                     + sVar11;
            pCVar5 = (this->denyCidrs).builder.endPtr;
            lVar12 = (long)pCVar5 - (long)pCVar4 >> 3;
            if ((ulong)(lVar12 * -0x5555555555555555) < uVar14) {
              uVar13 = lVar12 * 0x5555555555555556;
              if (pCVar5 == pCVar4) {
                uVar13 = 4;
              }
              if (uVar13 < uVar14) {
                uVar13 = uVar14;
              }
              Vector<kj::CidrRange>::setCapacity(this_01,uVar13);
            }
            pRVar6 = (this->denyCidrs).builder.pos;
            if (sVar11 != 0) {
              memcpy(pRVar6,AVar15.ptr,sVar11 * 0x18);
            }
            (this->denyCidrs).builder.pos = pRVar6 + sVar11;
            goto LAB_00422946;
          }
          if (sVar3 == 5) goto switchD_00422821_caseD_0;
          if (sVar3 == 0xe) goto switchD_00422821_caseD_9;
          if (sVar3 == 7) goto switchD_00422821_caseD_2;
          break;
        case 9:
          goto switchD_00422821_caseD_9;
        }
        break;
      case 9:
switchD_00422821_caseD_9:
        iVar8 = bcmp(pcVar2,"unix-abstract",sVar3);
        if (iVar8 != 0) break;
        this->allowAbstractUnix = false;
        goto LAB_00422946;
      }
      CidrRange::CidrRange(&local_50,(StringPtr)AVar7);
      pCVar4 = (this->denyCidrs).builder.endPtr;
      if ((this->denyCidrs).builder.pos == pCVar4) {
        pCVar5 = (this_01->builder).ptr;
        sVar11 = ((long)pCVar4 - (long)pCVar5 >> 3) * 0x5555555555555556;
        if (pCVar4 == pCVar5) {
          sVar11 = 4;
        }
        Vector<kj::CidrRange>::setCapacity(this_01,sVar11);
      }
      pRVar6 = (this->denyCidrs).builder.pos;
      *(undefined8 *)(pRVar6->bits + 0xc) = local_50._16_8_;
      pRVar6->family = local_50.family;
      pRVar6->bits[0] = local_50.bits[0];
      pRVar6->bits[1] = local_50.bits[1];
      pRVar6->bits[2] = local_50.bits[2];
      pRVar6->bits[3] = local_50.bits[3];
      *(undefined8 *)(pRVar6->bits + 4) = local_50.bits._4_8_;
      ppRVar1 = &(this->denyCidrs).builder.pos;
      *ppRVar1 = *ppRVar1 + 1;
LAB_00422946:
      pAVar9 = pAVar9 + 1;
    } while (pAVar9 != pAVar10);
  }
  return;
}

Assistant:

NetworkFilter::NetworkFilter(ArrayPtr<const StringPtr> allow, ArrayPtr<const StringPtr> deny,
                             NetworkFilter& next)
    : allowUnix(false), allowAbstractUnix(false), next(next) {
  for (auto rule: allow) {
    if (rule == "local") {
      allowCidrs.addAll(localCidrs());
    } else if (rule == "network") {
      // Can't be represented as a simple union of CIDRs, so we handle in shouldAllow().
      allowNetwork = true;
    } else if (rule == "private") {
      allowCidrs.addAll(privateCidrs());
      allowCidrs.addAll(localCidrs());
    } else if (rule == "public") {
      // Can't be represented as a simple union of CIDRs, so we handle in shouldAllow().
      allowPublic = true;
    } else if (rule == "unix") {
      allowUnix = true;
    } else if (rule == "unix-abstract") {
      allowAbstractUnix = true;
    } else {
      allowCidrs.add(CidrRange(rule));
    }
  }

  for (auto rule: deny) {
    if (rule == "local") {
      denyCidrs.addAll(localCidrs());
    } else if (rule == "network") {
      KJ_FAIL_REQUIRE("don't deny 'network', allow 'local' instead");
    } else if (rule == "private") {
      denyCidrs.addAll(privateCidrs());
    } else if (rule == "public") {
      // Tricky: What if we allow 'network' and deny 'public'?
      KJ_FAIL_REQUIRE("don't deny 'public', allow 'private' instead");
    } else if (rule == "unix") {
      allowUnix = false;
    } else if (rule == "unix-abstract") {
      allowAbstractUnix = false;
    } else {
      denyCidrs.add(CidrRange(rule));
    }
  }
}